

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_start(mixed_segment *segment)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  void *pvVar4;
  ulong uVar5;
  
  pvVar4 = segment->data;
  uVar5 = 0;
  do {
    if (*(byte *)((long)pvVar4 + 0xe0) == uVar5) {
      bVar3 = *(byte *)((long)pvVar4 + 0xe1);
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 - bVar3 == -1) {
          return 1;
        }
        uVar1 = uVar5 + 1;
        lVar2 = uVar5 * 8;
        uVar5 = uVar1;
      } while (*(long *)((long)pvVar4 + lVar2 + 0x78) != 0);
      mixed_err(0x16);
      return (uint)(bVar3 <= uVar1);
    }
    lVar2 = uVar5 * 8;
    uVar5 = uVar5 + 1;
  } while (*(long *)((long)pvVar4 + lVar2) != 0);
  mixed_err(0x16);
  return 0;
}

Assistant:

int channel_start(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;
  for(mixed_channel_t i=0; i<data->in_channels; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->out_channels; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}